

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O2

void gb_sound_w_internal(gb_sound_t *gb,UINT8 offset,UINT8 data)

{
  SOUND *snd;
  byte *pbVar1;
  UINT8 UVar2;
  char cVar3;
  UINT8 UVar4;
  byte bVar5;
  _Bool _Var6;
  ushort uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  undefined7 in_register_00000031;
  int iVar11;
  
  uVar8 = CONCAT71(in_register_00000031,offset) & 0xffffffff;
  bVar10 = gb->snd_regs[uVar8];
  UVar2 = (gb->snd_control).on;
  if (UVar2 != '\0') {
    gb->snd_regs[uVar8] = data;
  }
  switch(offset) {
  case '\0':
    (gb->snd_1).reg[0] = data;
    (gb->snd_1).sweep_shift = data & 7;
    (gb->snd_1).sweep_direction = -(data >> 3 & 1) | 1;
    (gb->snd_1).sweep_time = data >> 4 & 7;
    if ((data >> 3 & 1) != 0) {
      return;
    }
    if ((bVar10 & 8) == 0) {
      return;
    }
    if ((gb->snd_1).sweep_neg_mode_used != true) {
      return;
    }
    goto LAB_00149144;
  case '\x01':
    (gb->snd_1).reg[1] = data;
    if (UVar2 != '\0') {
      (gb->snd_1).duty = data >> 6;
    }
    (gb->snd_1).length = data & 0x3f;
    (gb->snd_1).length_counting = true;
    break;
  case '\x02':
    (gb->snd_1).reg[2] = data;
    (gb->snd_1).envelope_value = data >> 4;
    (gb->snd_1).envelope_direction = -((data & 8) == 0) | 1;
    (gb->snd_1).envelope_time = data & 7;
    _Var6 = gb_dac_enabled(&gb->snd_1);
    if (_Var6) {
      return;
    }
LAB_00149144:
    (gb->snd_1).on = false;
    break;
  case '\x03':
    (gb->snd_1).reg[3] = data;
    if ((gb->snd_1).sweep_enabled != false) {
      return;
    }
    bVar10 = (gb->snd_1).reg[4];
    uVar7 = (ushort)data;
    goto LAB_001492f6;
  case '\x04':
    snd = &gb->snd_1;
    (gb->snd_1).reg[4] = data;
    bVar10 = gb->snd_regs[4];
    bVar5 = (gb->snd_1).reg[3];
    _Var6 = (gb->snd_1).length_enabled;
    (gb->snd_1).length_enabled = (_Bool)(data >> 6 & 1);
    (gb->snd_1).frequency = (ushort)bVar5 | (bVar10 & 7) << 8;
    if (((_Var6 == false) && (((gb->snd_control).cycles & 0x2000) == 0)) &&
       (((gb->snd_1).length_counting == true && ((data >> 6 & 1) != 0)))) {
      gb_tick_length(snd);
    }
    if ((char)data < '\0') {
      (gb->snd_1).on = true;
      (gb->snd_1).envelope_enabled = true;
      (gb->snd_1).envelope_value = (gb->snd_1).reg[2] >> 4;
      (gb->snd_1).envelope_count = (gb->snd_1).envelope_time;
      UVar2 = (gb->snd_1).sweep_time;
      (gb->snd_1).sweep_count = UVar2;
      (gb->snd_1).sweep_neg_mode_used = false;
      (gb->snd_1).signal = '\0';
      if (gb->LegacyMode != '\0') {
        (gb->snd_1).length = (gb->snd_1).reg[1] & 0x3f;
      }
      (gb->snd_1).length_counting = true;
      uVar7 = (ushort)(gb->snd_1).reg[3] | ((gb->snd_1).reg[4] & 7) << 8;
      (gb->snd_1).frequency = uVar7;
      (gb->snd_1).frequency_counter = uVar7;
      (gb->snd_1).cycles_left = 0;
      (gb->snd_1).duty_count = 0;
      UVar4 = (gb->snd_1).sweep_shift;
      (gb->snd_1).sweep_enabled = UVar2 != '\0' || UVar4 != '\0';
      _Var6 = gb_dac_enabled(snd);
      if (!_Var6) {
        (gb->snd_1).on = false;
      }
      if (UVar4 != '\0') {
        gb_calculate_next_sweep(snd);
      }
      if ((gb->snd_1).length != '\0') {
        return;
      }
      cVar3 = (gb->snd_1).length_enabled;
      goto joined_r0x00149477;
    }
    if ((gb->snd_1).sweep_enabled != false) {
      return;
    }
    bVar10 = (gb->snd_1).reg[4];
    uVar7 = (ushort)(gb->snd_1).reg[3];
LAB_001492f6:
    (gb->snd_1).frequency = uVar7 | (bVar10 & 7) << 8;
    break;
  case '\x06':
    (gb->snd_2).reg[1] = data;
    if (UVar2 != '\0') {
      (gb->snd_2).duty = data >> 6;
    }
    (gb->snd_2).length = data & 0x3f;
    (gb->snd_2).length_counting = true;
    break;
  case '\a':
    (gb->snd_2).reg[2] = data;
    (gb->snd_2).envelope_value = data >> 4;
    (gb->snd_2).envelope_direction = -((data & 8) == 0) | 1;
    (gb->snd_2).envelope_time = data & 7;
    _Var6 = gb_dac_enabled(&gb->snd_2);
    if (!_Var6) {
      (gb->snd_2).on = false;
    }
    break;
  case '\b':
    (gb->snd_2).reg[3] = data;
    bVar10 = (gb->snd_2).reg[4];
    uVar7 = (ushort)data;
LAB_00149378:
    (gb->snd_2).frequency = uVar7 | (bVar10 & 7) << 8;
    break;
  case '\t':
    snd = &gb->snd_2;
    (gb->snd_2).reg[4] = data;
    _Var6 = (gb->snd_2).length_enabled;
    (gb->snd_2).length_enabled = (_Bool)((data & 0x40) >> 6);
    if ((((_Var6 == false) && (((gb->snd_control).cycles & 0x2000) == 0)) && ((data & 0x40) != 0))
       && ((gb->snd_2).length_counting != false)) {
      gb_tick_length(snd);
    }
    if (-1 < (char)data) {
      bVar10 = (gb->snd_2).reg[4];
      uVar7 = (ushort)(gb->snd_2).reg[3];
      goto LAB_00149378;
    }
    (gb->snd_2).on = true;
    (gb->snd_2).envelope_enabled = true;
    (gb->snd_2).envelope_value = (gb->snd_2).reg[2] >> 4;
    (gb->snd_2).envelope_count = (gb->snd_2).envelope_time;
    uVar7 = (ushort)(gb->snd_2).reg[3] | ((gb->snd_2).reg[4] & 7) << 8;
    (gb->snd_2).frequency = uVar7;
    (gb->snd_2).frequency_counter = uVar7;
    (gb->snd_2).cycles_left = 0;
    (gb->snd_2).duty_count = 0;
    (gb->snd_2).signal = '\0';
    if (gb->LegacyMode != '\0') {
      (gb->snd_2).length = (gb->snd_2).reg[1] & 0x3f;
    }
    (gb->snd_2).length_counting = true;
    _Var6 = gb_dac_enabled(snd);
    if (!_Var6) {
      (gb->snd_2).on = false;
    }
    if ((gb->snd_2).length != '\0') {
      return;
    }
    cVar3 = (gb->snd_2).length_enabled;
    goto joined_r0x00149477;
  case '\n':
    (gb->snd_3).reg[0] = data;
    _Var6 = gb_dac_enabled(&gb->snd_3);
    if (_Var6) {
      if (gb->LegacyMode != '\0') {
        (gb->snd_3).on = true;
      }
    }
    else {
      (gb->snd_3).on = false;
    }
    break;
  case '\v':
    (gb->snd_3).reg[1] = data;
    (gb->snd_3).length = data;
    (gb->snd_3).length_counting = true;
    break;
  case '\f':
    (gb->snd_3).reg[2] = data;
    (gb->snd_3).level = data >> 5 & 3;
    break;
  case '\r':
    (gb->snd_3).reg[3] = data;
    bVar10 = (gb->snd_3).reg[4];
    uVar7 = (ushort)data;
LAB_0014909a:
    (gb->snd_3).frequency = uVar7 | (bVar10 & 7) << 8;
    break;
  case '\x0e':
    snd = &gb->snd_3;
    (gb->snd_3).reg[4] = data;
    _Var6 = (gb->snd_3).length_enabled;
    (gb->snd_3).length_enabled = (_Bool)((data & 0x40) >> 6);
    if (((_Var6 == false) && (((gb->snd_control).cycles & 0x2000) == 0)) &&
       (((data & 0x40) != 0 && ((gb->snd_3).length_counting != false)))) {
      gb_tick_length(snd);
    }
    if (-1 < (char)data) {
      bVar10 = (gb->snd_3).reg[4];
      uVar7 = (ushort)(gb->snd_3).reg[3];
      goto LAB_0014909a;
    }
    if ((((gb->snd_3).on == true) && ((gb->snd_3).frequency_counter == 0x7ff)) &&
       ((gb->gbMode == '\0' && (gb->NoWaveCorrupt == '\0')))) {
      bVar10 = (gb->snd_3).offset;
      if (bVar10 < 8) {
        gb->snd_regs[0x20] = gb->snd_regs[(ulong)(bVar10 >> 1) + 0x20];
      }
      else {
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          gb->snd_regs[lVar9 + 0x20] = gb->snd_regs[lVar9 + (ulong)(bVar10 >> 3) * 4 + 0x20];
        }
      }
    }
    (gb->snd_3).on = true;
    (gb->snd_3).offset = '\0';
    (gb->snd_3).duty = '\x01';
    (gb->snd_3).duty_count = 0;
    if (gb->LegacyMode != '\0') {
      (gb->snd_3).length = (gb->snd_3).reg[1];
    }
    (gb->snd_3).length_counting = true;
    uVar7 = (ushort)(gb->snd_3).reg[3] | ((gb->snd_3).reg[4] & 7) << 8;
    (gb->snd_3).frequency = uVar7;
    (gb->snd_3).frequency_counter = uVar7;
    (gb->snd_3).cycles_left = -6;
    (gb->snd_3).sample_reading = false;
    _Var6 = gb_dac_enabled(snd);
    if (!_Var6) {
      (gb->snd_3).on = false;
    }
    if ((gb->snd_3).length != '\0') {
      return;
    }
    cVar3 = (gb->snd_3).length_enabled;
    goto joined_r0x00149477;
  case '\x10':
    (gb->snd_4).reg[1] = data;
    (gb->snd_4).length = data & 0x3f;
    (gb->snd_4).length_counting = true;
    break;
  case '\x11':
    (gb->snd_4).reg[2] = data;
    (gb->snd_4).envelope_value = data >> 4;
    (gb->snd_4).envelope_direction = -((data & 8) == 0) | 1;
    (gb->snd_4).envelope_time = data & 7;
    _Var6 = gb_dac_enabled(&gb->snd_4);
    if (!_Var6) {
      (gb->snd_4).on = false;
    }
    break;
  case '\x12':
    (gb->snd_4).reg[3] = data;
    (gb->snd_4).noise_short = (_Bool)(data >> 3 & 1);
    break;
  case '\x13':
    snd = &gb->snd_4;
    (gb->snd_4).reg[4] = data;
    _Var6 = (gb->snd_4).length_enabled;
    (gb->snd_4).length_enabled = (_Bool)((data & 0x40) >> 6);
    if ((((_Var6 == false) && (((gb->snd_control).cycles & 0x2000) == 0)) && ((data & 0x40) != 0))
       && ((gb->snd_4).length_counting != false)) {
      gb_tick_length(snd);
    }
    if (-1 < (char)data) {
      return;
    }
    (gb->snd_4).on = true;
    (gb->snd_4).envelope_enabled = true;
    (gb->snd_4).envelope_value = (gb->snd_4).reg[2] >> 4;
    (gb->snd_4).envelope_count = (gb->snd_4).envelope_time;
    (gb->snd_4).frequency_counter = 0;
    bVar10 = (gb->snd_4).reg[3];
    (gb->snd_4).cycles_left =
         *(int *)(gb_noise_period_cycles_divisor + (ulong)(bVar10 & 7) * 4) << (bVar10 >> 4);
    (gb->snd_4).signal = -1;
    (gb->snd_4).noise_lfsr = 0x7fff;
    if (gb->LegacyMode != '\0') {
      (gb->snd_4).length = (gb->snd_4).reg[1] & 0x3f;
    }
    (gb->snd_4).length_counting = true;
    _Var6 = gb_dac_enabled(snd);
    if (!_Var6) {
      (gb->snd_4).on = false;
    }
    if ((gb->snd_4).length != '\0') {
      return;
    }
    cVar3 = (gb->snd_4).length_enabled;
joined_r0x00149477:
    if ((cVar3 == '\x01') && (((gb->snd_control).cycles & 0x2000) == 0)) {
      gb_tick_length(snd);
      return;
    }
    break;
  case '\x14':
    (gb->snd_control).vol_left = data & 7;
    (gb->snd_control).vol_right = data >> 4 & 7;
    break;
  case '\x15':
    (gb->snd_control).mode1_right = data & 1;
    (gb->snd_control).mode1_left = data >> 4 & 1;
    (gb->snd_control).mode2_right = data >> 1 & 1;
    (gb->snd_control).mode2_left = data >> 5 & 1;
    (gb->snd_control).mode3_right = data >> 2 & 1;
    (gb->snd_control).mode3_left = data >> 6 & 1;
    (gb->snd_control).mode4_right = data >> 3 & 1;
    (gb->snd_control).mode4_left = data >> 7;
    break;
  case '\x16':
    bVar10 = data & 0x80;
    if (bVar10 == 0) {
      if (gb->gbMode == '\x01') {
        gb_sound_w_internal(gb,'\0','\0');
        (gb->snd_1).duty = '\0';
        gb_sound_w_internal(gb,'\x01','\0');
        gb_sound_w_internal(gb,'\x02','\0');
        gb_sound_w_internal(gb,'\x03','\0');
        gb_sound_w_internal(gb,'\x04','\0');
        (gb->snd_1).length_counting = false;
        (gb->snd_1).sweep_neg_mode_used = false;
        gb_sound_w_internal(gb,'\x06','\0');
        gb_sound_w_internal(gb,'\a','\0');
        gb_sound_w_internal(gb,'\b','\0');
        gb_sound_w_internal(gb,'\t','\0');
        (gb->snd_2).length_counting = false;
        gb_sound_w_internal(gb,'\n','\0');
        gb_sound_w_internal(gb,'\v','\0');
        gb_sound_w_internal(gb,'\f','\0');
        gb_sound_w_internal(gb,'\r','\0');
        gb_sound_w_internal(gb,'\x0e','\0');
        (gb->snd_3).length_counting = false;
        (gb->snd_3).current_sample = '\0';
        gb_sound_w_internal(gb,'\x10','\0');
LAB_0014986e:
        gb_sound_w_internal(gb,'\x11','\0');
        gb_sound_w_internal(gb,'\x12','\0');
        gb_sound_w_internal(gb,'\x13','\0');
        (gb->snd_4).length_counting = false;
        bVar5 = (gb->snd_4).reg[3];
        (gb->snd_4).cycles_left =
             *(int *)(gb_noise_period_cycles_divisor + (ulong)(bVar5 & 7) * 4) << (bVar5 >> 4);
      }
      else if (gb->gbMode == '\0') {
        gb_sound_w_internal(gb,'\0','\0');
        (gb->snd_1).duty = '\0';
        gb->snd_regs[1] = '\0';
        gb_sound_w_internal(gb,'\x02','\0');
        gb_sound_w_internal(gb,'\x03','\0');
        gb_sound_w_internal(gb,'\x04','\0');
        (gb->snd_1).length_counting = false;
        (gb->snd_1).sweep_neg_mode_used = false;
        gb->snd_regs[6] = '\0';
        gb_sound_w_internal(gb,'\a','\0');
        gb_sound_w_internal(gb,'\b','\0');
        gb_sound_w_internal(gb,'\t','\0');
        (gb->snd_2).length_counting = false;
        gb_sound_w_internal(gb,'\n','\0');
        gb_sound_w_internal(gb,'\f','\0');
        gb_sound_w_internal(gb,'\r','\0');
        gb_sound_w_internal(gb,'\x0e','\0');
        (gb->snd_3).length_counting = false;
        (gb->snd_3).current_sample = '\0';
        gb->snd_regs[0x10] = '\0';
        goto LAB_0014986e;
      }
      (gb->snd_1).on = false;
      (gb->snd_2).on = false;
      (gb->snd_3).on = false;
      (gb->snd_4).on = false;
      (gb->snd_control).wave_ram_locked = false;
      for (iVar11 = -2; iVar11 != 0; iVar11 = iVar11 + 1) {
        gb_sound_w_internal(gb,(char)iVar11 + '\x16','\0');
      }
    }
    else if (UVar2 == '\0') {
      pbVar1 = (byte *)((long)&(gb->snd_control).cycles + 1);
      *pbVar1 = *pbVar1 | 0xe0;
    }
    (gb->snd_control).on = bVar10 != 0;
    gb->snd_regs[0x16] = bVar10;
  }
  return;
}

Assistant:

static void gb_sound_w_internal(gb_sound_t *gb, UINT8 offset, UINT8 data)
{
	/* Store the value */
	UINT8 old_data = gb->snd_regs[offset];

	if (gb->snd_control.on)
	{
		gb->snd_regs[offset] = data;
	}

	switch (offset)
	{
	/*MODE 1 */
	case NR10: /* Sweep (R/W) */
		gb->snd_1.reg[0] = data;
		gb->snd_1.sweep_shift = data & 0x7;
		gb->snd_1.sweep_direction = (data & 0x8) ? -1 : 1;
		gb->snd_1.sweep_time = (data & 0x70) >> 4;
		if ((old_data & 0x08) && !(data & 0x08) && gb->snd_1.sweep_neg_mode_used)
		{
			gb->snd_1.on = false;
		}
		break;
	case NR11: /* Sound length/Wave pattern duty (R/W) */
		gb->snd_1.reg[1] = data;
		if (gb->snd_control.on)
		{
			gb->snd_1.duty = (data & 0xc0) >> 6;
		}
		gb->snd_1.length = data & 0x3f;
		gb->snd_1.length_counting = true;
		break;
	case NR12: /* Envelope (R/W) */
		gb->snd_1.reg[2] = data;
		gb->snd_1.envelope_value = data >> 4;
		gb->snd_1.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_1.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_1))
		{
			gb->snd_1.on = false;
		}
		break;
	case NR13: /* Frequency lo (R/W) */
		gb->snd_1.reg[3] = data;
		// Only enabling the frequency line breaks blarggs's sound test #5
		// This condition may not be correct
		if (!gb->snd_1.sweep_enabled)
		{
			gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
		}
		break;
	case NR14: /* Frequency hi / Initialize (R/W) */
		gb->snd_1.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_1.length_enabled;

			gb->snd_1.length_enabled = (data & 0x40) ? true : false;
			gb->snd_1.frequency = ((gb->snd_regs[NR14] & 0x7) << 8) | gb->snd_1.reg[3];

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_1.length_counting)
			{
				if (gb->snd_1.length_enabled)
				{
					gb_tick_length(&gb->snd_1);
				}
			}

			if (data & 0x80)
			{
				gb->snd_1.on = true;
				gb->snd_1.envelope_enabled = true;
				gb->snd_1.envelope_value = gb->snd_1.reg[2] >> 4;
				gb->snd_1.envelope_count = gb->snd_1.envelope_time;
				gb->snd_1.sweep_count = gb->snd_1.sweep_time;
				gb->snd_1.sweep_neg_mode_used = false;
				gb->snd_1.signal = 0;
				if (gb->LegacyMode)
					gb->snd_1.length = gb->snd_1.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_1.length_counting = true;
				gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
				gb->snd_1.frequency_counter = gb->snd_1.frequency;
				gb->snd_1.cycles_left = 0;
				gb->snd_1.duty_count = 0;
				gb->snd_1.sweep_enabled = (gb->snd_1.sweep_shift != 0) || (gb->snd_1.sweep_time != 0);
				if (!gb_dac_enabled(&gb->snd_1))
				{
					gb->snd_1.on = false;
				}
				if (gb->snd_1.sweep_shift > 0)
				{
					gb_calculate_next_sweep(&gb->snd_1);
				}

				if (gb->snd_1.length == 0 && gb->snd_1.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_1);
				}
			}
			else
			{
				// This condition may not be correct
				if (!gb->snd_1.sweep_enabled)
				{
					gb->snd_1.frequency = ((gb->snd_1.reg[4] & 0x7) << 8) | gb->snd_1.reg[3];
				}
			}
		}
		break;

	/*MODE 2 */
	case NR21: /* Sound length/Wave pattern duty (R/W) */
		gb->snd_2.reg[1] = data;
		if (gb->snd_control.on)
		{
			gb->snd_2.duty = (data & 0xc0) >> 6;
		}
		gb->snd_2.length = data & 0x3f;
		gb->snd_2.length_counting = true;
		break;
	case NR22: /* Envelope (R/W) */
		gb->snd_2.reg[2] = data;
		gb->snd_2.envelope_value = data >> 4;
		gb->snd_2.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_2.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_2))
		{
			gb->snd_2.on = false;
		}
		break;
	case NR23: /* Frequency lo (R/W) */
		gb->snd_2.reg[3] = data;
		gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
		break;
	case NR24: /* Frequency hi / Initialize (R/W) */
		gb->snd_2.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_2.length_enabled;

			gb->snd_2.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_2.length_counting)
			{
				if (gb->snd_2.length_enabled)
				{
					gb_tick_length(&gb->snd_2);
				}
			}

			if (data & 0x80)
			{
				gb->snd_2.on = true;
				gb->snd_2.envelope_enabled = true;
				gb->snd_2.envelope_value = gb->snd_2.reg[2] >> 4;
				gb->snd_2.envelope_count = gb->snd_2.envelope_time;
				gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
				gb->snd_2.frequency_counter = gb->snd_2.frequency;
				gb->snd_2.cycles_left = 0;
				gb->snd_2.duty_count = 0;
				gb->snd_2.signal = 0;
				if (gb->LegacyMode)
					gb->snd_2.length = gb->snd_2.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_2.length_counting = true;

				if (!gb_dac_enabled(&gb->snd_2))
				{
					gb->snd_2.on = false;
				}

				if (gb->snd_2.length == 0 && gb->snd_2.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_2);
				}
			}
			else
			{
				gb->snd_2.frequency = ((gb->snd_2.reg[4] & 0x7) << 8) | gb->snd_2.reg[3];
			}
		}
		break;

	/*MODE 3 */
	case NR30: /* Sound On/Off (R/W) */
		gb->snd_3.reg[0] = data;
		if (!gb_dac_enabled(&gb->snd_3))
		{
			gb->snd_3.on = false;
		}
		else if (gb->LegacyMode)
			gb->snd_3.on = true;	// even more VGM log fix -Valley Bell
		break;
	case NR31: /* Sound Length (R/W) */
		gb->snd_3.reg[1] = data;
		gb->snd_3.length = data;
		gb->snd_3.length_counting = true;
		break;
	case NR32: /* Select Output Level */
		gb->snd_3.reg[2] = data;
		gb->snd_3.level = (data & 0x60) >> 5;
		break;
	case NR33: /* Frequency lo (W) */
		gb->snd_3.reg[3] = data;
		gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
		break;
	case NR34: /* Frequency hi / Initialize (W) */
		gb->snd_3.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_3.length_enabled;

			gb->snd_3.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_3.length_counting)
			{
				if (gb->snd_3.length_enabled)
				{
					gb_tick_length(&gb->snd_3);
				}
			}

			if (data & 0x80)
			{
				if (gb->snd_3.on && gb->snd_3.frequency_counter == 0x7ff)
				{
					gb_corrupt_wave_ram(gb);
				}
				gb->snd_3.on = true;
				gb->snd_3.offset = 0;
				gb->snd_3.duty = 1;
				gb->snd_3.duty_count = 0;
				if (gb->LegacyMode)
					gb->snd_3.length = gb->snd_3.reg[1];	// VGM log fix -Valley Bell
				gb->snd_3.length_counting = true;
				gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
				gb->snd_3.frequency_counter = gb->snd_3.frequency;
				// There is a tiny bit of delay in starting up the wave channel
				gb->snd_3.cycles_left = -6;
				gb->snd_3.sample_reading = false;

				if (!gb_dac_enabled(&gb->snd_3))
				{
					gb->snd_3.on = false;
				}

				if (gb->snd_3.length == 0 && gb->snd_3.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_3);
				}
			}
			else
			{
				gb->snd_3.frequency = ((gb->snd_3.reg[4] & 0x7) << 8) | gb->snd_3.reg[3];
			}
		}
		break;

	/*MODE 4 */
	case NR41: /* Sound Length (R/W) */
		gb->snd_4.reg[1] = data;
		gb->snd_4.length = data & 0x3f;
		gb->snd_4.length_counting = true;
		break;
	case NR42: /* Envelope (R/W) */
		gb->snd_4.reg[2] = data;
		gb->snd_4.envelope_value = data >> 4;
		gb->snd_4.envelope_direction = (data & 0x8) ? 1 : -1;
		gb->snd_4.envelope_time = data & 0x07;
		if (!gb_dac_enabled(&gb->snd_4))
		{
			gb->snd_4.on = false;
		}
		break;
	case NR43: /* Polynomial Counter/Frequency */
		gb->snd_4.reg[3] = data;
		gb->snd_4.noise_short = (data & 0x8);
		break;
	case NR44: /* Counter/Consecutive / Initialize (R/W)  */
		gb->snd_4.reg[4] = data;
		{
			bool length_was_enabled = gb->snd_4.length_enabled;

			gb->snd_4.length_enabled = (data & 0x40) ? true : false;

			if (!length_was_enabled && !(gb->snd_control.cycles & FRAME_CYCLES) && gb->snd_4.length_counting)
			{
				if (gb->snd_4.length_enabled)
				{
					gb_tick_length(&gb->snd_4);
				}
			}

			if (data & 0x80)
			{
				gb->snd_4.on = true;
				gb->snd_4.envelope_enabled = true;
				gb->snd_4.envelope_value = gb->snd_4.reg[2] >> 4;
				gb->snd_4.envelope_count = gb->snd_4.envelope_time;
				gb->snd_4.frequency_counter = 0;
				gb->snd_4.cycles_left = gb_noise_period_cycles(gb);
				gb->snd_4.signal = -1;
				gb->snd_4.noise_lfsr = 0x7fff;
				if (gb->LegacyMode)
					gb->snd_4.length = gb->snd_4.reg[1] & 0x3f;	// VGM log fix -Valley Bell
				gb->snd_4.length_counting = true;

				if (!gb_dac_enabled(&gb->snd_4))
				{
					gb->snd_4.on = false;
				}

				if (gb->snd_4.length == 0 && gb->snd_4.length_enabled && !(gb->snd_control.cycles & FRAME_CYCLES))
				{
					gb_tick_length(&gb->snd_4);
				}
			}
		}
		break;

	/* CONTROL */
	case NR50: /* Channel Control / On/Off / Volume (R/W)  */
		gb->snd_control.vol_left = data & 0x7;
		gb->snd_control.vol_right = (data & 0x70) >> 4;
		break;
	case NR51: /* Selection of Sound Output Terminal */
		gb->snd_control.mode1_right = data & 0x1;
		gb->snd_control.mode1_left = (data & 0x10) >> 4;
		gb->snd_control.mode2_right = (data & 0x2) >> 1;
		gb->snd_control.mode2_left = (data & 0x20) >> 5;
		gb->snd_control.mode3_right = (data & 0x4) >> 2;
		gb->snd_control.mode3_left = (data & 0x40) >> 6;
		gb->snd_control.mode4_right = (data & 0x8) >> 3;
		gb->snd_control.mode4_left = (data & 0x80) >> 7;
		break;
	case NR52: // Sound On/Off (R/W)
		// Only bit 7 is writable, writing to bits 0-3 does NOT enable or disable sound. They are read-only.
		if (!(data & 0x80))
		{
			// On DMG the length counters are not affected and not clocked
			// powering off should actually clear all registers
			gb_apu_power_off(gb);
		}
		else
		{
			if (!gb->snd_control.on)
			{
				// When switching on, the next step should be 0.
				gb->snd_control.cycles |= 7 * FRAME_CYCLES;
			}
		}
		gb->snd_control.on = (data & 0x80) ? true : false;
		gb->snd_regs[NR52] = data & 0x80;
		break;
	}
}